

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O2

Abc_Obj_t * Abc_NtkRetimeMinAreaConstructNtk_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
    if (uVar2 == 4) {
      pAVar3 = Abc_NtkRetimeMinAreaConstructNtk_rec
                         (pNtkNew,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
      (pObj->field_6).pCopy = pAVar3;
      return pAVar3;
    }
    if (uVar2 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                    ,0x157,
                    "Abc_Obj_t *Abc_NtkRetimeMinAreaConstructNtk_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    for (lVar4 = 0; lVar4 < (pObj->vFanins).nSize; lVar4 = lVar4 + 1) {
      Abc_NtkRetimeMinAreaConstructNtk_rec
                (pNtkNew,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]]);
    }
    Abc_NtkDupObj(pNtkNew,pObj,0);
    for (lVar4 = 0; lVar4 < (pObj->vFanins).nSize; lVar4 = lVar4 + 1) {
      Abc_ObjAddFanin((pObj->field_6).pCopy,
                      *(Abc_Obj_t **)
                       ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]] + 0x40));
    }
  }
  return (Abc_Obj_t *)(pObj->field_6).pTemp;
}

Assistant:

Abc_Obj_t * Abc_NtkRetimeMinAreaConstructNtk_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return pObj->pCopy;
    Abc_NodeSetTravIdCurrent(pObj);
    // consider the case of a latch output
    if ( Abc_ObjIsBi(pObj) )
    {
        pObj->pCopy = Abc_NtkRetimeMinAreaConstructNtk_rec( pNtkNew, Abc_ObjFanin0(pObj) );
        return pObj->pCopy;
    }
    assert( Abc_ObjIsNode(pObj) );
    // visit the fanins
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkRetimeMinAreaConstructNtk_rec( pNtkNew, pFanin );
    // compute the value of the node
    Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    return pObj->pCopy;
}